

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O1

void anurbs::NurbsCurveGeometry<3L>::save(Model *model,Type *data,Json *target)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  undefined4 extraout_var;
  DataWriter writer;
  DataWriter local_a0;
  undefined1 local_98 [40];
  string local_70;
  Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> local_50;
  
  pcVar1 = local_98 + 0x10;
  local_a0.m_data = target;
  local_98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"degree","");
  iVar3 = (*(data->super_CurveBase<3L>)._vptr_CurveBase[2])(data);
  local_70._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar3);
  DataWriter::write<long>(&local_a0,(string *)local_98,(long *)&local_70);
  if ((pointer)local_98._0_8_ != pcVar1) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  local_98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"nb_poles","");
  local_70._M_dataplus._M_p =
       (pointer)(data->m_poles).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_1,__1,_3>_>.
                m_storage.m_rows;
  DataWriter::write<long>(&local_a0,(string *)local_98,(long *)&local_70);
  if ((pointer)local_98._0_8_ != pcVar1) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  paVar2 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"knots","");
  knots((Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)local_98,
        data);
  DataWriter::
  write_vector<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
            (&local_a0,&local_70,
             (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
             local_98);
  free((void *)local_98._24_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"poles","");
  poles(&local_50,data);
  DataWriter::
  write_matrix<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>>
            (&local_a0,(string *)local_98,&local_50);
  free(local_50.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_1,__1,_3>_>.m_storage.
       m_data);
  if ((pointer)local_98._0_8_ != pcVar1) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if ((data->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != 0) {
    local_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"weights","");
    weights((Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)local_98
            ,data);
    DataWriter::
    write_vector<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
              (&local_a0,&local_70,
               (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
               local_98);
    free((void *)local_98._24_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

static void save(const Model& model, const Type& data, Json& target)
    {
        DataWriter writer(target);

        writer.write("degree", data.degree());
        writer.write("nb_poles", data.nb_poles());
        writer.write_vector("knots", data.knots());
        writer.write_matrix("poles", data.poles());

        if (data.is_rational()) {
            writer.write_vector("weights", data.weights());
        }
    }